

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O1

void language::formatMemberFnPtr(QTextStream *str,SignalSlot *s,OverloadUse useQOverload)

{
  char16_t *pcVar1;
  ulong originalLength;
  long lVar2;
  storage_type_conflict *psVar3;
  storage_type_conflict *psVar4;
  char cVar5;
  CutResult CVar6;
  ulong uVar7;
  QTextStream *pQVar8;
  ulong uVar9;
  QChar QVar10;
  QArrayData *pQVar11;
  long lVar12;
  char16_t *pcVar13;
  long lVar14;
  long in_FS_OFFSET;
  QByteArrayView QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QString local_88;
  QArrayData *local_68;
  char16_t *local_60;
  QStringView local_58;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.m_data = (s->signature).d.ptr;
  local_58.m_size = (s->signature).d.size;
  uVar7 = QStringView::indexOf(&local_58,(QChar)0x28,0,CaseSensitive);
  pcVar1 = (s->signature).d.ptr;
  originalLength = (s->signature).d.size;
  uVar9 = uVar7;
  if (originalLength < uVar7) {
    uVar9 = originalLength;
  }
  local_58.m_size = uVar7 + 1;
  local_88.d.d = (Data *)((originalLength - uVar7) + -2);
  CVar6 = QtPrivate::QContainerImplHelper::mid
                    (originalLength,&local_58.m_size,(qsizetype *)&local_88);
  pQVar11 = (QArrayData *)0x0;
  if (CVar6 != Null) {
    pQVar11 = &(local_88.d.d)->super_QArrayData;
  }
  if ((useQOverload == WhenAmbiguousOrEmpty) &&
     (pQVar11 == (QArrayData *)0x0 ||
      ((s->options).super_QFlagsStorageHelper<language::SignalSlotOption,_4>.
       super_QFlagsStorage<language::SignalSlotOption>.i & 1) != 0)) {
    pcVar13 = (char16_t *)0x0;
    if (CVar6 != Null) {
      pcVar13 = pcVar1 + local_58.m_size;
    }
    local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QVar15.m_data = (storage_type *)0xa;
    QVar15.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar15);
    local_88.d.d = (Data *)local_58.m_size;
    local_88.d.ptr = local_58.m_data;
    local_88.d.size = (qsizetype)local_48;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = pQVar11;
    local_60 = pcVar13;
    QStringView::split(&local_58,&local_68,0x2c,0,1);
    if (local_48 != (undefined1 *)0x0) {
      lVar12 = (long)local_48 << 4;
      lVar14 = 0;
      do {
        psVar4 = local_58.m_data;
        QVar10.ucs = (char16_t)&local_88;
        if (lVar14 != 0) {
          QString::append(QVar10);
        }
        lVar2 = *(long *)((long)psVar4 + lVar14);
        if ((lVar2 == 0) ||
           (psVar3 = *(storage_type_conflict **)((long)psVar4 + lVar14 + 8), *psVar3 != L'Q')) {
LAB_00153a43:
          QString::append((QChar *)&local_88,*(longlong *)((long)psVar4 + lVar14 + 8));
        }
        else {
          if (lVar2 == 5) {
            QVar17.m_data = "QSize";
            QVar17.m_size = 5;
            QVar22.m_data = psVar3;
            QVar22.m_size = 5;
            cVar5 = QtPrivate::equalStrings(QVar17,QVar22);
joined_r0x00153a41:
            if (cVar5 != '\0') goto LAB_00153a43;
          }
          else if (lVar2 == 6) {
            QVar16.m_data = "QPoint";
            QVar16.m_size = 6;
            QVar21.m_data = psVar3;
            QVar21.m_size = 6;
            cVar5 = QtPrivate::equalStrings(QVar16,QVar21);
            goto joined_r0x00153a41;
          }
          QVar18.m_data = &DAT_00000006;
          QVar18.m_size = (qsizetype)&local_88;
          QString::append(QVar18);
          QString::append((QChar *)&local_88,*(longlong *)((long)psVar4 + lVar14 + 8));
          QString::append(QVar10);
        }
        lVar14 = lVar14 + 0x10;
      } while (lVar12 != lVar14);
    }
    QString::append((QChar)(char16_t)&local_88);
    if ((QArrayData *)local_58.m_size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58.m_size,0x10,0x10);
      }
    }
    pQVar8 = (QTextStream *)QTextStream::operator<<(str,&local_88);
    QTextStream::operator<<(pQVar8,'(');
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar8 = (QTextStream *)QTextStream::operator<<(str,'&');
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,&s->className);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,"::");
    QVar20.m_data = pcVar1;
    QVar20.m_size = uVar9;
    QTextStream::operator<<(pQVar8,QVar20);
    QTextStream::operator<<(str,')');
  }
  else {
    pQVar8 = (QTextStream *)QTextStream::operator<<(str,'&');
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,&s->className);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,"::");
    QVar19.m_data = pcVar1;
    QVar19.m_size = uVar9;
    QTextStream::operator<<(pQVar8,QVar19);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void formatMemberFnPtr(QTextStream &str, const SignalSlot &s, OverloadUse useQOverload)
{
    const qsizetype parenPos = s.signature.indexOf(u'(');
    Q_ASSERT(parenPos >= 0);
    const auto functionName = QStringView{s.signature}.left(parenPos);

    const auto parameters = QStringView{s.signature}.mid(parenPos + 1,
                                               s.signature.size() - parenPos - 2);

    const bool isAmbiguous = s.options.testFlag(SignalSlotOption::Ambiguous);
    bool withOverload = false; // just to silence the compiler

    switch (useQOverload) {
    case OverloadUse::Always:
        withOverload = true;
        break;
    case OverloadUse::Never:
        withOverload = false;
        break;
    case OverloadUse::WhenAmbiguousOrEmpty:
        withOverload = parameters.empty() || isAmbiguous;
        break;
    }

    if (withOverload)
        str << formatOverload(parameters) << '(';

    str << '&' << s.className << "::" << functionName;

    if (withOverload)
        str << ')';
}